

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v64_intrinsics_c.h
# Opt level: O1

c_v128 c_v128_ssub_s8(c_v128 a,c_v128 b)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  c_v128 cVar5;
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = a.u64[1];
  auVar3._8_8_ = 0;
  auVar3._0_8_ = b.u64[1];
  auVar1 = vpsubsb_avx(auVar1,auVar3);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = a.u64[0];
  auVar4._8_8_ = 0;
  auVar4._0_8_ = b.u64[0];
  auVar2 = vpsubsb_avx(auVar2,auVar4);
  cVar5.u64[1] = auVar1._0_8_;
  cVar5.u64[0] = auVar2._0_8_;
  return cVar5;
}

Assistant:

SIMD_INLINE c_v64 c_v64_ssub_s8(c_v64 a, c_v64 b) {
  c_v64 t;
  int c;
  for (c = 0; c < 8; c++) {
    int16_t d = (int16_t)a.s8[c] - (int16_t)b.s8[c];
    t.s8[c] = SIMD_CLAMP(d, -128, 127);
  }
  return t;
}